

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::ConditionalExpr::to_string_abi_cxx11_(string *__return_storage_ptr__,ConditionalExpr *this)

{
  Var *pVVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  long *local_b8;
  pointer pcStack_b0;
  long local_a8;
  undefined8 uStack_a0;
  long *local_98;
  undefined8 uStack_90;
  long *local_88;
  undefined8 uStack_80;
  long local_78 [2];
  undefined1 auStack_68 [8];
  string cond_str;
  undefined8 uStack_40;
  long local_38 [3];
  
  pVVar1 = this->condition;
  if (pVVar1->type_ == Expression) {
    (*(pVVar1->super_IRNode)._vptr_IRNode[0x1f])(&local_b8);
    cond_str.field_2._8_8_ = local_b8;
    uStack_40 = pcStack_b0;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x5;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&cond_str.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_((string *)auStack_68,(detail *)0x24281b,format_str,args);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  else {
    (*(pVVar1->super_IRNode)._vptr_IRNode[0x1f])(auStack_68);
  }
  (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])
            ((undefined1 *)((long)&cond_str.field_2 + 8));
  (*(((this->super_Expr).right)->super_IRNode)._vptr_IRNode[0x1f])(&local_88);
  local_b8 = (long *)auStack_68;
  pcStack_b0 = cond_str._M_dataplus._M_p;
  local_a8 = cond_str.field_2._8_8_;
  uStack_a0 = uStack_40;
  local_98 = local_88;
  uStack_90 = uStack_80;
  format_str_00.size_ = 0xddd;
  format_str_00.data_ = (char *)0xe;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_b8;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)"{0} ? {1}: {2}",format_str_00,args_00);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)cond_str.field_2._8_8_ != local_38) {
    operator_delete((void *)cond_str.field_2._8_8_,local_38[0] + 1);
  }
  if (auStack_68 != (undefined1  [8])&cond_str._M_string_length) {
    operator_delete((void *)auStack_68,cond_str._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalExpr::to_string() const {
    std::string cond_str = condition->type() == VarType::Expression
                               ? ::format("({0})", condition->to_string())
                               : condition->to_string();
    return ::format("{0} ? {1}: {2}", cond_str, left->to_string(), right->to_string());
}